

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::ClosePopupsOverWindow(ImGuiWindow *ref_window,bool restore_focus_to_window_under_popup)

{
  ImGuiWindow **ppIVar1;
  uint uVar2;
  ImGuiPopupData *pIVar3;
  ImGuiWindow *pIVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  ImGuiWindow *pIVar8;
  ulong uVar9;
  
  uVar2 = (GImGui->OpenPopupStack).Size;
  uVar5 = (ulong)uVar2;
  if (uVar5 != 0) {
    uVar9 = 0;
    if ((ref_window == (ImGuiWindow *)0x0) || ((int)uVar2 < 1)) {
LAB_001e2c4a:
      if ((int)uVar9 < (int)uVar2) {
        if ((GImGui->DebugLogFlags & 4) != 0) {
          if (ref_window == (ImGuiWindow *)0x0) {
            pcVar7 = "<NULL>";
          }
          else {
            pcVar7 = ref_window->Name;
          }
          DebugLog("[popup] ClosePopupsOverWindow(\"%s\")\n",pcVar7);
        }
        ClosePopupToLevel((int)uVar9,restore_focus_to_window_under_popup);
        return;
      }
    }
    else {
      pIVar3 = (GImGui->OpenPopupStack).Data;
      uVar9 = 0;
      do {
        pIVar4 = pIVar3[uVar9].Window;
        if ((pIVar4 != (ImGuiWindow *)0x0) && (uVar6 = uVar9, (pIVar4->Flags & 0x1000000) == 0)) {
          do {
            pIVar4 = pIVar3[uVar6].Window;
            if (pIVar4 != (ImGuiWindow *)0x0) {
              pIVar8 = ref_window;
              if (ref_window->RootWindow == pIVar4) break;
              do {
                if (pIVar8 == pIVar4) goto LAB_001e2c40;
                ppIVar1 = &pIVar8->ParentWindowInBeginStack;
                pIVar8 = *ppIVar1;
              } while (*ppIVar1 != (ImGuiWindow *)0x0);
            }
            uVar6 = uVar6 + 1;
            if (uVar6 == uVar5) goto LAB_001e2c4a;
          } while( true );
        }
LAB_001e2c40:
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar5);
    }
  }
  return;
}

Assistant:

void ImGui::ClosePopupsOverWindow(ImGuiWindow* ref_window, bool restore_focus_to_window_under_popup)
{
    ImGuiContext& g = *GImGui;
    if (g.OpenPopupStack.Size == 0)
        return;

    // Don't close our own child popup windows.
    int popup_count_to_keep = 0;
    if (ref_window)
    {
        // Find the highest popup which is a descendant of the reference window (generally reference window = NavWindow)
        for (; popup_count_to_keep < g.OpenPopupStack.Size; popup_count_to_keep++)
        {
            ImGuiPopupData& popup = g.OpenPopupStack[popup_count_to_keep];
            if (!popup.Window)
                continue;
            IM_ASSERT((popup.Window->Flags & ImGuiWindowFlags_Popup) != 0);
            if (popup.Window->Flags & ImGuiWindowFlags_ChildWindow)
                continue;

            // Trim the stack unless the popup is a direct parent of the reference window (the reference window is often the NavWindow)
            // - With this stack of window, clicking/focusing Popup1 will close Popup2 and Popup3:
            //     Window -> Popup1 -> Popup2 -> Popup3
            // - Each popups may contain child windows, which is why we compare ->RootWindow!
            //     Window -> Popup1 -> Popup1_Child -> Popup2 -> Popup2_Child
            bool ref_window_is_descendent_of_popup = false;
            for (int n = popup_count_to_keep; n < g.OpenPopupStack.Size; n++)
                if (ImGuiWindow* popup_window = g.OpenPopupStack[n].Window)
                    if (IsWindowWithinBeginStackOf(ref_window, popup_window))
                    {
                        ref_window_is_descendent_of_popup = true;
                        break;
                    }
            if (!ref_window_is_descendent_of_popup)
                break;
        }
    }
    if (popup_count_to_keep < g.OpenPopupStack.Size) // This test is not required but it allows to set a convenient breakpoint on the statement below
    {
        IMGUI_DEBUG_LOG_POPUP("[popup] ClosePopupsOverWindow(\"%s\")\n", ref_window ? ref_window->Name : "<NULL>");
        ClosePopupToLevel(popup_count_to_keep, restore_focus_to_window_under_popup);
    }
}